

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O0

void __thiscall
fizplex::SimplexTest_LowerRowLowerVarUnbounded_Test::~SimplexTest_LowerRowLowerVarUnbounded_Test
          (SimplexTest_LowerRowLowerVarUnbounded_Test *this)

{
  void *in_RDI;
  
  ~SimplexTest_LowerRowLowerVarUnbounded_Test
            ((SimplexTest_LowerRowLowerVarUnbounded_Test *)0x1d1378);
  operator_delete(in_RDI,0xc0);
  return;
}

Assistant:

TEST_F(SimplexTest, LowerRowLowerVarUnbounded) {
  lp.add_column(ColType::LowerBound, 0, inf, -1);
  lp.add_row(RowType::LE, -inf, 14, {-2});

  solve_lp();
  EXPECT_EQ(Simplex::Result::Unbounded, result);
  EXPECT_TRUE(is_infinite(z));
}